

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

int xmlSchemaValidateFacetInternal
              (xmlSchemaFacetPtr facet,xmlSchemaWhitespaceValueType fws,xmlSchemaValType valType,
              xmlChar *value,xmlSchemaValPtr val,xmlSchemaWhitespaceValueType ws)

{
  xmlSchemaTypeType xVar1;
  xmlSchemaValPtr pxVar2;
  xmlGenericErrorFunc p_Var3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  xmlGenericErrorFunc *pp_Var8;
  void **ppvVar9;
  ulong uVar10;
  xmlChar *content;
  bool bVar11;
  
  if (facet == (xmlSchemaFacetPtr)0x0) {
    return -1;
  }
  xVar1 = facet->type;
  switch(xVar1) {
  case XML_SCHEMA_FACET_MININCLUSIVE:
    uVar7 = xmlSchemaCompareValues(val,facet->val);
    if (uVar7 == 0xfffffffe) {
      return -1;
    }
    iVar6 = 0x729;
    goto LAB_001d4b4a;
  case XML_SCHEMA_FACET_MINEXCLUSIVE:
    iVar6 = xmlSchemaCompareValues(val,facet->val);
    bVar11 = iVar6 == 1;
    iVar5 = 0x72b;
    goto LAB_001d4aae;
  case XML_SCHEMA_FACET_MAXINCLUSIVE:
    iVar6 = xmlSchemaCompareValues(val,facet->val);
    if (iVar6 == -2) {
      return -1;
    }
    uVar7 = iVar6 + 1;
    iVar6 = 0x72a;
LAB_001d4b4a:
    if (uVar7 < 2) {
      return 0;
    }
    return iVar6;
  case XML_SCHEMA_FACET_MAXEXCLUSIVE:
    iVar6 = xmlSchemaCompareValues(val,facet->val);
    bVar11 = iVar6 == -1;
    iVar5 = 0x72c;
LAB_001d4aae:
    if (bVar11) {
      iVar5 = 0;
    }
    if (iVar6 != -2) {
      return iVar5;
    }
    return -1;
  case XML_SCHEMA_FACET_TOTALDIGITS:
  case XML_SCHEMA_FACET_FRACTIONDIGITS:
    pxVar2 = facet->val;
    if (pxVar2 == (xmlSchemaValPtr)0x0) {
      return -1;
    }
    if (1 < pxVar2->type - XML_SCHEMAS_NNINTEGER) {
      return -1;
    }
    if (val == (xmlSchemaValPtr)0x0) {
      return -1;
    }
    if ((*(ushort *)((long)&pxVar2->value + 0x1c) & 0xfe) != 0) {
      return -1;
    }
    if ((0xc < val->type - XML_SCHEMAS_INTEGER) && (val->type != XML_SCHEMAS_DECIMAL)) {
      return -1;
    }
    if (xVar1 == XML_SCHEMA_FACET_FRACTIONDIGITS) {
      uVar10 = (ulong)(*(ushort *)((long)&val->value + 0x1c) >> 1 & 0x7f);
      iVar6 = 0x72e;
    }
    else {
      if (xVar1 != XML_SCHEMA_FACET_TOTALDIGITS) {
        return 0;
      }
      uVar10 = (ulong)*(byte *)((long)&val->value + 0x1d);
      iVar6 = 0x72d;
    }
    if ((pxVar2->value).decimal.lo < uVar10) {
      return iVar6;
    }
    break;
  case XML_SCHEMA_FACET_PATTERN:
    if (value == (xmlChar *)0x0) {
      return -1;
    }
    if (val == (xmlSchemaValPtr)0x0) {
      bVar11 = false;
    }
    else {
      bVar11 = true;
      if (1 < val->type - XML_SCHEMAS_STRING) {
        bVar11 = val->type - XML_SCHEMAS_TOKEN < 7;
      }
    }
    if ((!bVar11) || (content = (val->value).qname.name, content == (xmlChar *)0x0)) {
      content = value;
    }
    iVar6 = xmlRegexpExec(facet->regexp,content);
    if (iVar6 != 1) {
      if (iVar6 == 0) {
        return 0x72f;
      }
      return iVar6;
    }
    break;
  case XML_SCHEMA_FACET_ENUMERATION:
    if (ws == XML_SCHEMA_WHITESPACE_UNKNOWN) {
      if ((facet->value != (xmlChar *)0x0) && (iVar6 = xmlStrEqual(facet->value,value), iVar6 != 0))
      {
        return 0;
      }
      return 0x730;
    }
    iVar5 = xmlSchemaCompareValuesInternal
                      (facet->val->type,facet->val,facet->value,fws,valType,val,value,ws);
    iVar6 = 0x730;
    if (iVar5 == 0) {
      iVar6 = 0;
    }
    if (iVar5 != -2) {
      return iVar6;
    }
    return -1;
  case XML_SCHEMA_FACET_WHITESPACE:
    break;
  case XML_SCHEMA_FACET_LENGTH:
    if (valType == XML_SCHEMAS_QNAME) {
      return 0;
    }
    if (valType == XML_SCHEMAS_NOTATION) {
      return 0;
    }
LAB_001d4ad5:
    pxVar2 = facet->val;
    iVar6 = -1;
    if ((pxVar2 != (xmlSchemaValPtr)0x0) &&
       (((pxVar2->type == XML_SCHEMAS_NNINTEGER || (pxVar2->type == XML_SCHEMAS_DECIMAL)) &&
        ((*(byte *)((long)&pxVar2->value + 0x1c) & 0xfe) == 0)))) {
      if ((val == (xmlSchemaValPtr)0x0) ||
         ((val->type != XML_SCHEMAS_BASE64BINARY && (val->type != XML_SCHEMAS_HEXBINARY)))) {
        if (valType < XML_SCHEMAS_INTEGER) {
          if ((0x21d70000U >> (valType & XML_SCHEMAS_NPINTEGER) & 1) == 0) {
            if ((6U >> (valType & XML_SCHEMAS_NPINTEGER) & 1) == 0) goto LAB_001d4cc4;
            if (ws == XML_SCHEMA_WHITESPACE_UNKNOWN) {
              if (valType != XML_SCHEMAS_STRING) goto LAB_001d4c82;
LAB_001d4d48:
              uVar7 = xmlUTF8Strlen(value);
            }
            else {
              if (value == (xmlChar *)0x0) goto LAB_001d4cc0;
              if (ws != XML_SCHEMA_WHITESPACE_COLLAPSE) goto LAB_001d4d48;
LAB_001d4c82:
              uVar7 = xmlSchemaNormLen(value);
            }
            uVar10 = (ulong)uVar7;
          }
          else {
            if (value != (xmlChar *)0x0) goto LAB_001d4c82;
LAB_001d4cc0:
            uVar10 = 0;
          }
        }
        else {
LAB_001d4cc4:
          pp_Var8 = __xmlGenericError();
          p_Var3 = *pp_Var8;
          ppvVar9 = __xmlGenericErrorContext();
          uVar10 = 0;
          (*p_Var3)(*ppvVar9,"Unimplemented block at %s:%d\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemastypes.c"
                    ,0x15a9);
        }
      }
      else {
        uVar10 = (ulong)(val->value).hex.total;
      }
      iVar5 = (int)uVar10;
      uVar4 = (facet->val->value).decimal.lo;
      if (facet->type == XML_SCHEMA_FACET_MINLENGTH) {
        if (uVar4 <= uVar10) goto LAB_001d4d37;
        iVar6 = 0x727;
      }
      else if (facet->type == XML_SCHEMA_FACET_LENGTH) {
        if (uVar4 == uVar10) {
LAB_001d4d37:
          bVar11 = true;
          goto LAB_001d4afb;
        }
        iVar6 = 0x726;
      }
      else {
        if (uVar10 <= uVar4) goto LAB_001d4d37;
        iVar6 = 0x728;
      }
    }
LAB_001d4af9:
    iVar5 = iVar6;
    bVar11 = false;
    goto LAB_001d4afb;
  case XML_SCHEMA_FACET_MAXLENGTH:
  case XML_SCHEMA_FACET_MINLENGTH:
    iVar5 = 0;
    iVar6 = 0;
    if (valType == XML_SCHEMAS_QNAME) goto LAB_001d4af9;
    bVar11 = false;
    if (valType != XML_SCHEMAS_NOTATION) goto LAB_001d4ad5;
LAB_001d4afb:
    if (!bVar11) {
      return iVar5;
    }
    break;
  default:
    pp_Var8 = __xmlGenericError();
    p_Var3 = *pp_Var8;
    ppvVar9 = __xmlGenericErrorContext();
    (*p_Var3)(*ppvVar9,"Unimplemented block at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemastypes.c"
              ,0x15dc);
  }
  return 0;
}

Assistant:

static int
xmlSchemaValidateFacetInternal(xmlSchemaFacetPtr facet,
			       xmlSchemaWhitespaceValueType fws,
			       xmlSchemaValType valType,
			       const xmlChar *value,
			       xmlSchemaValPtr val,
			       xmlSchemaWhitespaceValueType ws)
{
    int ret;
    int stringType;

    if (facet == NULL)
	return(-1);

    switch (facet->type) {
	case XML_SCHEMA_FACET_PATTERN:
	    /*
	    * NOTE that for patterns, the @value needs to be the normalized
	    * value, *not* the lexical initial value or the canonical value.
	    */
	    if (value == NULL)
		return(-1);
	    /*
	    * If string-derived type, regexp must be tested on the value space of
	    * the datatype.
	    * See https://www.w3.org/TR/xmlschema-2/#rf-pattern
	    */
	    stringType = val && ((val->type >= XML_SCHEMAS_STRING && val->type <= XML_SCHEMAS_NORMSTRING)
			      || (val->type >= XML_SCHEMAS_TOKEN && val->type <= XML_SCHEMAS_NCNAME));
	    ret = xmlRegexpExec(facet->regexp,
	                        (stringType && val->value.str) ? val->value.str : value);
	    if (ret == 1)
		return(0);
	    if (ret == 0)
		return(XML_SCHEMAV_CVC_PATTERN_VALID);
	    return(ret);
	case XML_SCHEMA_FACET_MAXEXCLUSIVE:
	    ret = xmlSchemaCompareValues(val, facet->val);
	    if (ret == -2)
		return(-1);
	    if (ret == -1)
		return(0);
	    return(XML_SCHEMAV_CVC_MAXEXCLUSIVE_VALID);
	case XML_SCHEMA_FACET_MAXINCLUSIVE:
	    ret = xmlSchemaCompareValues(val, facet->val);
	    if (ret == -2)
		return(-1);
	    if ((ret == -1) || (ret == 0))
		return(0);
	    return(XML_SCHEMAV_CVC_MAXINCLUSIVE_VALID);
	case XML_SCHEMA_FACET_MINEXCLUSIVE:
	    ret = xmlSchemaCompareValues(val, facet->val);
	    if (ret == -2)
		return(-1);
	    if (ret == 1)
		return(0);
	    return(XML_SCHEMAV_CVC_MINEXCLUSIVE_VALID);
	case XML_SCHEMA_FACET_MININCLUSIVE:
	    ret = xmlSchemaCompareValues(val, facet->val);
	    if (ret == -2)
		return(-1);
	    if ((ret == 1) || (ret == 0))
		return(0);
	    return(XML_SCHEMAV_CVC_MININCLUSIVE_VALID);
	case XML_SCHEMA_FACET_WHITESPACE:
	    /* TODO whitespaces */
	    /*
	    * NOTE: Whitespace should be handled to normalize
	    * the value to be validated against a the facets;
	    * not to normalize the value in-between.
	    */
	    return(0);
	case  XML_SCHEMA_FACET_ENUMERATION:
	    if (ws == XML_SCHEMA_WHITESPACE_UNKNOWN) {
		/*
		* This is to ensure API compatibility with the old
		* xmlSchemaValidateFacet().
		* TODO: Get rid of this case.
		*/
		if ((facet->value != NULL) &&
		    (xmlStrEqual(facet->value, value)))
		    return(0);
	    } else {
		ret = xmlSchemaCompareValuesWhtspExt(facet->val->type,
		    facet->val, facet->value, fws, valType, val,
		    value, ws);
		if (ret == -2)
		    return(-1);
		if (ret == 0)
		    return(0);
	    }
	    return(XML_SCHEMAV_CVC_ENUMERATION_VALID);
	case XML_SCHEMA_FACET_LENGTH:
	    /*
	    * SPEC (1.3) "if {primitive type definition} is QName or NOTATION,
	    * then any {value} is facet-valid."
	    */
	    if ((valType == XML_SCHEMAS_QNAME) ||
		(valType == XML_SCHEMAS_NOTATION))
		return (0);
            /* Falls through. */
	case XML_SCHEMA_FACET_MAXLENGTH:
	case XML_SCHEMA_FACET_MINLENGTH: {
	    unsigned int len = 0;

	    if ((valType == XML_SCHEMAS_QNAME) ||
		(valType == XML_SCHEMAS_NOTATION))
		return (0);
	    /*
	    * TODO: length, maxLength and minLength must be of type
	    * nonNegativeInteger only. Check if decimal is used somehow.
	    */
	    if ((facet->val == NULL) ||
		((facet->val->type != XML_SCHEMAS_DECIMAL) &&
		 (facet->val->type != XML_SCHEMAS_NNINTEGER)) ||
		(facet->val->value.decimal.frac != 0)) {
		return(-1);
	    }
	    if ((val != NULL) && (val->type == XML_SCHEMAS_HEXBINARY))
		len = val->value.hex.total;
	    else if ((val != NULL) && (val->type == XML_SCHEMAS_BASE64BINARY))
		len = val->value.base64.total;
	    else {
		switch (valType) {
		    case XML_SCHEMAS_STRING:
		    case XML_SCHEMAS_NORMSTRING:
			if (ws == XML_SCHEMA_WHITESPACE_UNKNOWN) {
			    /*
			    * This is to ensure API compatibility with the old
			    * xmlSchemaValidateFacet(). Anyway, this was and
			    * is not the correct handling.
			    * TODO: Get rid of this case somehow.
			    */
			    if (valType == XML_SCHEMAS_STRING)
				len = xmlUTF8Strlen(value);
			    else
				len = xmlSchemaNormLen(value);
			} else if (value != NULL) {
			    if (ws == XML_SCHEMA_WHITESPACE_COLLAPSE)
				len = xmlSchemaNormLen(value);
			    else
				/*
				* Should be OK for "preserve" as well.
				*/
				len = xmlUTF8Strlen(value);
			}
			break;
		    case XML_SCHEMAS_IDREF:
		    case XML_SCHEMAS_TOKEN:
		    case XML_SCHEMAS_LANGUAGE:
		    case XML_SCHEMAS_NMTOKEN:
		    case XML_SCHEMAS_NAME:
		    case XML_SCHEMAS_NCNAME:
		    case XML_SCHEMAS_ID:
		    case XML_SCHEMAS_ANYURI:
			if (value != NULL)
			    len = xmlSchemaNormLen(value);
			break;
		    default:
		        TODO
		}
	    }
	    if (facet->type == XML_SCHEMA_FACET_LENGTH) {
		if (len != facet->val->value.decimal.lo)
		    return(XML_SCHEMAV_CVC_LENGTH_VALID);
	    } else if (facet->type == XML_SCHEMA_FACET_MINLENGTH) {
		if (len < facet->val->value.decimal.lo)
		    return(XML_SCHEMAV_CVC_MINLENGTH_VALID);
	    } else {
		if (len > facet->val->value.decimal.lo)
		    return(XML_SCHEMAV_CVC_MAXLENGTH_VALID);
	    }
	    break;
	}
	case XML_SCHEMA_FACET_TOTALDIGITS:
	case XML_SCHEMA_FACET_FRACTIONDIGITS:

	    if ((facet->val == NULL) ||
		((facet->val->type != XML_SCHEMAS_PINTEGER) &&
		 (facet->val->type != XML_SCHEMAS_NNINTEGER)) ||
		(facet->val->value.decimal.frac != 0)) {
		return(-1);
	    }
	    if ((val == NULL) ||
		((val->type != XML_SCHEMAS_DECIMAL) &&
		 (val->type != XML_SCHEMAS_INTEGER) &&
		 (val->type != XML_SCHEMAS_NPINTEGER) &&
		 (val->type != XML_SCHEMAS_NINTEGER) &&
		 (val->type != XML_SCHEMAS_NNINTEGER) &&
		 (val->type != XML_SCHEMAS_PINTEGER) &&
		 (val->type != XML_SCHEMAS_INT) &&
		 (val->type != XML_SCHEMAS_UINT) &&
		 (val->type != XML_SCHEMAS_LONG) &&
		 (val->type != XML_SCHEMAS_ULONG) &&
		 (val->type != XML_SCHEMAS_SHORT) &&
		 (val->type != XML_SCHEMAS_USHORT) &&
		 (val->type != XML_SCHEMAS_BYTE) &&
		 (val->type != XML_SCHEMAS_UBYTE))) {
		return(-1);
	    }
	    if (facet->type == XML_SCHEMA_FACET_TOTALDIGITS) {
	        if (val->value.decimal.total > facet->val->value.decimal.lo)
	            return(XML_SCHEMAV_CVC_TOTALDIGITS_VALID);

	    } else if (facet->type == XML_SCHEMA_FACET_FRACTIONDIGITS) {
	        if (val->value.decimal.frac > facet->val->value.decimal.lo)
		    return(XML_SCHEMAV_CVC_FRACTIONDIGITS_VALID);
	    }
	    break;
	default:
	    TODO
    }
    return(0);

}